

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bake.c
# Opt level: O0

err_t bakeSWU(octet *pt,bign_params *params,octet *msg)

{
  bool_t bVar1;
  err_t eVar2;
  blob_t dest;
  octet *in_RDX;
  ec_o *in_RSI;
  word *in_RDI;
  word *W;
  void *state;
  err_t code;
  size_t in_stack_ffffffffffffffc8;
  bign_params *in_stack_ffffffffffffffd0;
  uint in_stack_ffffffffffffffd8;
  err_t local_4;
  
  bVar1 = memIsValid(in_RSI,0x150);
  if (bVar1 == 0) {
    local_4 = 0x6d;
  }
  else {
    bVar1 = bignIsOperable(in_stack_ffffffffffffffd0);
    if (bVar1 == 0) {
      local_4 = 0x1f6;
    }
    else {
      bVar1 = memIsValid(in_RDX,(in_RSI->hdr).keep >> 2);
      if ((bVar1 != 0) && (bVar1 = memIsValid(in_RDI,(in_RSI->hdr).keep >> 1), bVar1 != 0)) {
        bignStart_keep((size_t)params,(bign_deep_i)msg);
        dest = blobCreate(in_stack_ffffffffffffffc8);
        if (dest == (blob_t)0x0) {
          return 0x6e;
        }
        eVar2 = bignStart(state,(bign_params *)W);
        if (eVar2 != 0) {
          blobClose((blob_t)0x11b5cc);
          return eVar2;
        }
        bakeSWU2(in_RDI,in_RSI,in_RDX,(void *)(ulong)in_stack_ffffffffffffffd8);
        u64To(dest,(size_t)in_RDI,(u64 *)0x11b618);
        blobClose((blob_t)0x11b622);
        return 0;
      }
      local_4 = 0x6d;
    }
  }
  return local_4;
}

Assistant:

err_t bakeSWU(octet pt[], const bign_params* params, const octet msg[])
{
	err_t code;
	void* state;
	word* W;
	// проверить входные данные
	if (!memIsValid(params, sizeof(bign_params)))
		return ERR_BAD_INPUT;
	if (!bignIsOperable(params))
		return ERR_BAD_PARAMS;
	if (!memIsValid(msg, params->l / 4) ||
		!memIsValid(pt, params->l / 2))
		return ERR_BAD_INPUT;
	// создать состояние
	state = blobCreate(bignStart_keep(params->l, bakeSWU2_deep));
	if (state == 0)
		return ERR_OUTOFMEMORY;
	// старт
	code = bignStart(state, params);
	ERR_CALL_HANDLE(code, blobClose(state));
	// основные действия
	W = (word*)pt;
	bakeSWU2(W, (const ec_o*)state, msg, objEnd(state, void));
	wwTo(pt, params->l / 2, W);
	// завершение
	blobClose(state);
	return ERR_OK;
}